

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

void __thiscall S2Polygon::InitLoops(S2Polygon *this,LoopMap *loop_map)

{
  pointer *ppuVar1;
  iterator __position;
  int iVar2;
  mapped_type *pmVar3;
  uint uVar4;
  ulong uVar5;
  S2Loop *loop;
  S2Loop *child;
  stack<S2Loop_*,_std::deque<S2Loop_*,_std::allocator<S2Loop_*>_>_> loop_stack;
  _Head_base<0UL,_S2Loop_*,_false> local_100;
  ulong local_f8;
  S2Loop *local_f0;
  vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
  *local_e8;
  LoopMap *local_e0;
  _Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_> local_d8;
  _Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_> local_88;
  
  local_100._M_head_impl = (S2Loop *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e0 = loop_map;
  std::deque<S2Loop*,std::allocator<S2Loop*>>::_M_range_initialize<S2Loop*const*>
            ((deque<S2Loop*,std::allocator<S2Loop*>> *)&local_88,&local_100);
  std::_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>::_Deque_base(&local_d8,&local_88);
  std::_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>::~_Deque_base(&local_88);
  if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_e8 = (vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                *)&this->loops_;
    local_f8 = 0xffffffff;
    do {
      if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_100._M_head_impl = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]
        ;
        operator_delete(local_d8._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_100._M_head_impl = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      if (local_100._M_head_impl != (S2Loop *)0x0) {
        local_f8 = (ulong)(uint)(local_100._M_head_impl)->depth_;
        __position._M_current =
             (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->loops_).
            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
          ::_M_realloc_insert<S2Loop*&>(local_e8,__position,&local_100._M_head_impl);
        }
        else {
          ((__position._M_current)->_M_t).
          super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
          super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
          super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl = local_100._M_head_impl;
          ppuVar1 = &(this->loops_).
                     super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
      }
      pmVar3 = std::
               map<S2Loop_*,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>,_std::less<S2Loop_*>,_std::allocator<std::pair<S2Loop_*const,_std::vector<S2Loop_*,_std::allocator<S2Loop_*>_>_>_>_>
               ::operator[](local_e0,&local_100._M_head_impl);
      uVar5 = (ulong)((long)(pmVar3->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar3->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl
                           .super__Vector_impl_data._M_start) >> 3;
      if (-1 < (int)uVar5 + -1) {
        iVar2 = (int)local_f8;
        do {
          uVar4 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar4;
          local_f0 = (pmVar3->super__Vector_base<S2Loop_*,_std::allocator<S2Loop_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar5];
          if (local_f0 == (S2Loop *)0x0) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)&local_88,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                       ,0x128,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_88._M_impl.super__Deque_impl_data._M_map_size,
                       "Check failed: child != nullptr ",0x1f);
            abort();
          }
          local_f0->depth_ = iVar2 + 1;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<S2Loop*,std::allocator<S2Loop*>>::_M_push_back_aux<S2Loop*const&>
                      ((deque<S2Loop*,std::allocator<S2Loop*>> *)&local_d8,&local_f0);
          }
          else {
            *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_f0;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        } while (0 < (int)uVar4);
      }
    } while (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_d8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<S2Loop_*,_std::allocator<S2Loop_*>_>::~_Deque_base(&local_d8);
  return;
}

Assistant:

void S2Polygon::InitLoops(LoopMap* loop_map) {
  std::stack<S2Loop*> loop_stack({nullptr});
  int depth = -1;
  while (!loop_stack.empty()) {
    S2Loop* loop = loop_stack.top();
    loop_stack.pop();
    if (loop != nullptr) {
      depth = loop->depth();
      loops_.emplace_back(loop);
    }
    const vector<S2Loop*>& children = (*loop_map)[loop];
    for (int i = children.size() - 1; i >= 0; --i) {
      S2Loop* child = children[i];
      S2_DCHECK(child != nullptr);
      child->set_depth(depth + 1);
      loop_stack.push(child);
    }
  }
}